

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDynCalls.cpp
# Opt level: O2

void __thiscall wasm::GenerateDynCalls::visitTable(GenerateDynCalls *this,Table *table)

{
  Module *pMVar1;
  __normal_iterator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_*,_std::vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>_>
  _Var2;
  Module **in_RCX;
  anon_class_16_2_3fe77c5f visitor;
  Table *table_local;
  vector<wasm::Name,_std::allocator<wasm::Name>_> tableSegmentData;
  Module *wasm;
  
  pMVar1 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>_>
           ).super_PostWalker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>.
           super_Walker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>.
           currModule;
  tableSegmentData.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pMVar1;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<wasm::ElementSegment,std::default_delete<wasm::ElementSegment>>*,std::vector<std::unique_ptr<wasm::ElementSegment,std::default_delete<wasm::ElementSegment>>,std::allocator<std::unique_ptr<wasm::ElementSegment,std::default_delete<wasm::ElementSegment>>>>>,__gnu_cxx::__ops::_Iter_pred<wasm::GenerateDynCalls::visitTable(wasm::Table*)::_lambda(std::unique_ptr<wasm::ElementSegment,std::default_delete<wasm::ElementSegment>>&)_1_>>
                    ((pMVar1->elementSegments).
                     super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (pMVar1->elementSegments).
                     super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  if (_Var2._M_current !=
      (pMVar1->elementSegments).
      super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    table_local = (Table *)0x0;
    tableSegmentData.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    tableSegmentData.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    visitor.wasm = in_RCX;
    visitor.this = (GenerateDynCalls *)
                   &tableSegmentData.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
    ElementUtils::
    iterElementSegmentFunctionNames<wasm::GenerateDynCalls::visitTable(wasm::Table*)::_lambda(wasm::Name,unsigned_int)_1_>
              ((ElementUtils *)
               ((_Var2._M_current)->_M_t).
               super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
               .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl,
               (ElementSegment *)this,visitor);
    std::_Vector_base<wasm::Name,_std::allocator<wasm::Name>_>::~_Vector_base
              ((_Vector_base<wasm::Name,_std::allocator<wasm::Name>_> *)&table_local);
  }
  return;
}

Assistant:

void visitTable(Table* table) {
    // Generate dynCalls for functions in the table
    Module* wasm = getModule();
    auto& segments = wasm->elementSegments;

    // Find a single elem segment for the table. We only care about one, since
    // wasm-ld emits only one table with a single segment.
    auto it = std::find_if(segments.begin(),
                           segments.end(),
                           [&](std::unique_ptr<ElementSegment>& segment) {
                             return segment->table == table->name;
                           });
    if (it != segments.end()) {
      std::vector<Name> tableSegmentData;
      ElementUtils::iterElementSegmentFunctionNames(
        it->get(), [&](Name name, Index) {
          generateDynCallThunk(wasm->getFunction(name)->type);
        });
    }
  }